

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

Vec_Int_t *
Abc_NtkCollectCopies(Abc_Ntk_t *p,Gia_Man_t *pGia,Vec_Ptr_t **pvNodesR,Vec_Bit_t **pvPolar)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *p_00;
  Vec_Int_t *p_01;
  Vec_Ptr_t *p_02;
  Vec_Bit_t *p_03;
  Vec_Bit_t *p_04;
  Gia_Obj_t *pGVar3;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  void *pvVar7;
  int iVar8;
  uint v;
  
  pGVar3 = (Gia_Obj_t *)0x0;
  p_00 = Abc_NtkDfs(p,0);
  p_01 = Vec_IntAlloc(p->vObjs->nSize);
  p_02 = Vec_PtrStart(pGia->nObjs);
  p_03 = Vec_BitStart(pGia->nObjs);
  p_04 = Vec_BitStart(pGia->nObjs);
  for (iVar8 = 0; iVar8 < pGia->vCis->nSize; iVar8 = iVar8 + 1) {
    pGVar3 = Gia_ManCi(pGia,iVar8);
    uVar2 = Gia_ObjId(pGia,pGVar3);
    if (uVar2 == 0) break;
    pAVar4 = Abc_NtkCi(p,iVar8);
    pcVar5 = Abc_ObjName(pAVar4);
    pcVar5 = Abc_UtilStrsav(pcVar5);
    pGVar3 = (Gia_Obj_t *)(ulong)uVar2;
    Vec_PtrWriteEntry(p_02,uVar2,pcVar5);
  }
  for (iVar8 = 0; iVar8 < pGia->vCos->nSize; iVar8 = iVar8 + 1) {
    pGVar3 = Gia_ManCo(pGia,iVar8);
    uVar2 = Gia_ObjId(pGia,pGVar3);
    if (uVar2 == 0) break;
    pGVar3 = Gia_ManObj(pGia,uVar2);
    Vec_BitWriteEntry(p_03,uVar2 - (*(uint *)pGVar3 & 0x1fffffff),1);
    pAVar4 = Abc_NtkCo(p,iVar8);
    pcVar5 = Abc_ObjName(pAVar4);
    pcVar5 = Abc_UtilStrsav(pcVar5);
    Vec_PtrWriteEntry(p_02,uVar2,pcVar5);
    pGVar3 = (Gia_Obj_t *)(ulong)uVar2;
    Vec_IntPush(p_01,uVar2);
  }
  for (uVar2 = 0; iVar8 = (int)pGVar3, (int)uVar2 < p_00->nSize; uVar2 = uVar2 + 1) {
    pGVar3 = (Gia_Obj_t *)(ulong)uVar2;
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p_00,uVar2);
    uVar1 = (pAVar4->field_6).iTemp;
    if (-1 < (int)uVar1) {
      v = uVar1 >> 1;
      pGVar3 = (Gia_Obj_t *)(ulong)v;
      pGVar6 = Gia_ManObj(pGia,v);
      if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
        pGVar3 = (Gia_Obj_t *)(ulong)v;
        iVar8 = Vec_BitEntry(p_03,v);
        if (iVar8 == 0) {
          pGVar3 = (Gia_Obj_t *)(ulong)v;
          pvVar7 = Vec_PtrEntry(p_02,v);
          if (pvVar7 == (void *)0x0) {
            pcVar5 = Abc_ObjName(pAVar4);
            pcVar5 = Abc_UtilStrsav(pcVar5);
            Vec_PtrWriteEntry(p_02,v,pcVar5);
            Vec_IntPush(p_01,v);
            pGVar3 = (Gia_Obj_t *)(ulong)v;
            Vec_BitWriteEntry(p_04,v,uVar1 & 1);
          }
        }
      }
    }
  }
  Vec_BitFree(p_03);
  Vec_PtrFree(p_00);
  Vec_IntSort(p_01,iVar8);
  *pvNodesR = p_02;
  *pvPolar = p_04;
  return p_01;
}

Assistant:

Vec_Int_t * Abc_NtkCollectCopies( Abc_Ntk_t * p, Gia_Man_t * pGia, Vec_Ptr_t ** pvNodesR, Vec_Bit_t ** pvPolar )
{
    int i, iObj, iLit;
    Abc_Obj_t * pObj;
    Vec_Ptr_t * vObjs   = Abc_NtkDfs( p, 0 );
    Vec_Int_t * vNodes  = Vec_IntAlloc( Abc_NtkObjNumMax(p) );
    Vec_Ptr_t * vNodesR = Vec_PtrStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vDriver = Vec_BitStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vPolar  = Vec_BitStart( Gia_ManObjNum(pGia) );
    Gia_ManForEachCiId( pGia, iObj, i )
        Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Abc_ObjName(Abc_NtkCi(p, i))) );
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        Vec_BitWriteEntry( vDriver, Gia_ObjFaninId0(Gia_ManObj(pGia, iObj), iObj), 1 );
        Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Abc_ObjName(Abc_NtkCo(p, i))) );
        Vec_IntPush( vNodes, iObj );
    }
    Vec_PtrForEachEntry( Abc_Obj_t *, vObjs, pObj, i )
        if ( (iLit = pObj->iTemp) >= 0 && Gia_ObjIsAnd(Gia_ManObj(pGia, Abc_Lit2Var(iLit))) )
        {
            if ( !Vec_BitEntry(vDriver, Abc_Lit2Var(iLit)) && Vec_PtrEntry(vNodesR, Abc_Lit2Var(iLit)) == NULL )
            {
                Vec_PtrWriteEntry( vNodesR, Abc_Lit2Var(iLit), Abc_UtilStrsav(Abc_ObjName(pObj)) );
                Vec_IntPush( vNodes, Abc_Lit2Var(iLit) );
                Vec_BitWriteEntry( vPolar, Abc_Lit2Var(iLit), Abc_LitIsCompl(iLit) );
            }
        }
    Vec_BitFree( vDriver );
    Vec_PtrFree( vObjs );
    Vec_IntSort( vNodes, 0 );
    *pvNodesR = vNodesR;
    *pvPolar  = vPolar;
    return vNodes;
}